

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

void __thiscall
zmq::endpoint_uri_pair_t::endpoint_uri_pair_t
          (endpoint_uri_pair_t *this,string *local,string *remote,endpoint_type_t param_3)

{
  std::__cxx11::string::string((string *)this,(string *)local);
  std::__cxx11::string::string((string *)&this->remote,(string *)remote);
  this->local_type = param_3;
  return;
}

Assistant:

endpoint_uri_pair_t (const std::string &local,
                         const std::string &remote,
                         endpoint_type_t local_type) :
        local (local),
        remote (remote),
        local_type (local_type)
    {
    }